

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_dr_flac__seek_flac_frame(ma_dr_flac *pFlac)

{
  ma_dr_flac_bs *bs;
  byte bVar1;
  ma_uint8 mVar2;
  ushort uVar3;
  uint uVar4;
  ma_bool32 mVar5;
  uint uVar6;
  uint uVar7;
  undefined8 in_RAX;
  ulong uVar8;
  ushort uVar9;
  ma_result mVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  size_t bitsToSeek;
  long lVar14;
  undefined8 uStack_38;
  ma_uint16 desiredCRC16;
  
  bVar1 = (&DAT_00177980)[(char)(pFlac->currentFLACFrame).header.channelAssignment];
  bs = &pFlac->bs;
  lVar14 = 0;
  mVar10 = MA_ERROR;
  uStack_38 = in_RAX;
  do {
    if ((ulong)bVar1 * 0x10 == lVar14) {
      mVar5 = ma_dr_flac__seek_bits(bs,(ulong)(-(pFlac->bs).consumedBits & 7));
      if (mVar5 != 0) {
        uVar12 = (pFlac->bs).consumedBits;
        uVar9 = (pFlac->bs).crc16;
        uVar11 = (ulong)uVar9;
        uVar6 = (uint)uVar9;
        uVar8 = (pFlac->bs).crc16Cache;
        if (uVar12 == 0x40) {
          uVar7 = (uint)uVar8;
          uVar3 = (ushort)(uVar8 >> 0x30);
          uVar13 = (uint)(uVar8 >> 0x10);
          uVar12 = (uint)(uVar8 >> 0x18);
          uVar4 = (uint)(uVar8 >> 0x20);
          switch((pFlac->bs).crc16CacheIgnoredBytes) {
          case 0:
            uVar9 = ma_dr_flac__crc16_table
                    [((uint)ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [(uVar4 >> 8 ^
                                     ((uint)ma_dr_flac__crc16_table
                                            [(uint)(uVar9 >> 8) ^ (uint)(byte)(uVar8 >> 0x38)] << 8
                                     ^ (uint)ma_dr_flac__crc16_table
                                             [((uint)uVar3 ^
                                              ((uint)uVar9 << 8 ^
                                              (uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar9 >> 8) ^
                                                     (uint)(byte)(uVar8 >> 0x38)]) >> 8 & 0xff) &
                                              0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                    [((uint)uVar3 ^
                                                     ((uint)uVar9 << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar9 >> 8) ^
                                                            (uint)(byte)(uVar8 >> 0x38)]) >> 8 &
                                                     0xff) & 0xff] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(uVar4 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar9 >> 8) ^
                                                            (uint)(byte)(uVar8 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar3 ^
                                                           ((uint)uVar9 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar9 >> 8) ^
                                                                  (uint)(byte)(uVar8 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                             8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar12 & 0xff] << 8 ^
                      uVar7 ^ (uint)ma_dr_flac__crc16_table
                                    [(((uint)ma_dr_flac__crc16_table
                                             [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar3 ^
                                                               ((uint)uVar9 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar9 >> 8) ^
                                                                      (uint)(byte)(uVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar4 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar9 >> 8) ^
                                                                      (uint)(byte)(uVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar3 ^
                                                                             ((uint)uVar9 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar9 >> 8) ^ (uint)(byte)(uVar8 >> 0x38)]
                                                  ) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8
                                                  & 0xff) & 0xff] << 8 ^
                                      (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [(uVar4 >> 8 ^
                                                     ((uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar9 >> 8) ^
                                                             (uint)(byte)(uVar8 >> 0x38)] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [((uint)uVar3 ^
                                                            ((uint)uVar9 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar9 >> 8) ^
                                                                   (uint)(byte)(uVar8 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                           [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar3 ^
                                                                             ((uint)uVar9 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar9 >> 8) ^ (uint)(byte)(uVar8 >> 0x38)]
                                                  ) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar9 >> 8) ^
                                                                 (uint)(byte)(uVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar3 ^
                                                                ((uint)uVar9 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar9 >> 8) ^
                                                                       (uint)(byte)(uVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                             uVar12 & 0xff]) >> 8 & 0xff ^ uVar13 & 0xffff) & 0xff])
                     >> 8 & 0xff] << 8 ^
                    ma_dr_flac__crc16_table
                    [(((uint)ma_dr_flac__crc16_table
                             [(((uint)ma_dr_flac__crc16_table
                                      [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                       [((uint)uVar3 ^
                                                        ((uint)uVar9 << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar9 >> 8) ^
                                                               (uint)(byte)(uVar8 >> 0x38)]) >> 8 &
                                                        0xff) & 0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar4 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar9 >> 8) ^
                                                               (uint)(byte)(uVar8 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar3 ^
                                                              ((uint)uVar9 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar9 >> 8) ^
                                                                     (uint)(byte)(uVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                               (uint)ma_dr_flac__crc16_table
                                     [((uint)ma_dr_flac__crc16_table
                                             [(uVar4 >> 8 ^
                                              ((uint)ma_dr_flac__crc16_table
                                                     [(uint)(uVar9 >> 8) ^
                                                      (uint)(byte)(uVar8 >> 0x38)] << 8 ^
                                              (uint)ma_dr_flac__crc16_table
                                                    [((uint)uVar3 ^
                                                     ((uint)uVar9 << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar9 >> 8) ^
                                                            (uint)(byte)(uVar8 >> 0x38)]) >> 8 &
                                                     0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                      (uint)ma_dr_flac__crc16_table
                                            [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar3 ^
                                                              ((uint)uVar9 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar9 >> 8) ^
                                                                     (uint)(byte)(uVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar4 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar9 >> 8) ^
                                                                     (uint)(byte)(uVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar3 ^
                                                                         ((uint)uVar9 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar9 >> 8) ^ (uint)(byte)(uVar8 >> 0x38)]
                                                  ) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8
                                                  & 0xff) & 0xff]) >> 8 & 0xff ^ uVar12 & 0xff]) >>
                               8 & 0xff ^ uVar13 & 0xffff) & 0xff] << 8 ^
                      (uint)ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar4 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar9 >> 8) ^
                                                     (uint)(byte)(uVar8 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar3 ^
                                                    ((uint)uVar9 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar9 >> 8) ^
                                                           (uint)(byte)(uVar8 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar3 ^
                                                             ((uint)uVar9 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar9 >> 8) ^
                                                                    (uint)(byte)(uVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uVar4 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar9 >> 8) ^
                                                                    (uint)(byte)(uVar8 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar3 ^
                                                                        ((uint)uVar9 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar9 >> 8) ^ (uint)(byte)(uVar8 >> 0x38)]
                                                  ) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8
                                                  & 0xff) & 0xff]) >> 8 & 0xff ^ uVar12 & 0xff] << 8
                              ^ uVar7 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar3 ^
                                                              ((uint)uVar9 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar9 >> 8) ^
                                                                     (uint)(byte)(uVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar4 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar9 >> 8) ^
                                                                     (uint)(byte)(uVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar3 ^
                                                                         ((uint)uVar9 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar9 >> 8) ^ (uint)(byte)(uVar8 >> 0x38)]
                                                  ) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8
                                                  & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar4 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar9 >> 8) ^
                                                            (uint)(byte)(uVar8 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar3 ^
                                                           ((uint)uVar9 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar9 >> 8) ^
                                                                  (uint)(byte)(uVar8 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar3 ^
                                                                         ((uint)uVar9 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar9 >> 8) ^ (uint)(byte)(uVar8 >> 0x38)]
                                                  ) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar9 >> 8) ^
                                                                 (uint)(byte)(uVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar3 ^
                                                                ((uint)uVar9 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar9 >> 8) ^
                                                                       (uint)(byte)(uVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar12 & 0xff]) >> 8 & 0xff ^ uVar13 & 0xffff) & 0xff])
                             >> 8 & 0xff]) >> 8 & 0xff ^ uVar7) & 0xff];
            (pFlac->bs).crc16 = uVar9;
            break;
          case 1:
            uVar11 = (ulong)(ushort)(uVar9 << 8 ^
                                    ma_dr_flac__crc16_table[(ushort)(uVar3 ^ uVar9 >> 8) & 0xff]);
          case 2:
            uVar11 = (ulong)(ushort)((ushort)((int)uVar11 << 8) ^
                                    ma_dr_flac__crc16_table
                                    [(uVar4 >> 8 ^ (uint)(uVar11 >> 8)) & 0xff]);
          case 3:
            uVar11 = (ulong)(ushort)((ushort)((int)uVar11 << 8) ^
                                    ma_dr_flac__crc16_table[(uVar4 ^ (uint)(uVar11 >> 8)) & 0xff]);
          case 4:
            uVar11 = (ulong)(ushort)((ushort)((int)uVar11 << 8) ^
                                    ma_dr_flac__crc16_table[(uint)(uVar11 >> 8) ^ uVar12 & 0xff]);
          case 5:
            uVar6 = (uint)(ushort)((ushort)((int)uVar11 << 8) ^
                                  ma_dr_flac__crc16_table
                                  [((uint)(uVar11 >> 8) ^ uVar13 & 0xffff) & 0xff]);
          case 6:
            uVar11 = (ulong)(ushort)((ushort)(uVar6 << 8) ^
                                    ma_dr_flac__crc16_table[(uVar7 ^ uVar6) >> 8 & 0xff]);
          case 7:
            uVar9 = (ushort)((int)uVar11 << 8) ^
                    ma_dr_flac__crc16_table[(uVar7 ^ (uint)(uVar11 >> 8)) & 0xff];
          default:
            (pFlac->bs).crc16 = uVar9;
            (pFlac->bs).crc16CacheIgnoredBytes = 0;
          }
        }
        else {
          uVar8 = uVar8 >> (-(char)uVar12 & 0x3fU);
          uVar13 = (uint)(uVar8 >> 0x20);
          switch(~(pFlac->bs).crc16CacheIgnoredBytes + (uVar12 >> 3)) {
          case 7:
            uVar6 = (uint)(ushort)(uVar9 << 8 ^
                                  ma_dr_flac__crc16_table
                                  [(uint)(uVar9 >> 8) ^ (uint)(byte)(uVar8 >> 0x38)]);
          case 6:
            uVar6 = (uint)(ushort)((ushort)(uVar6 << 8) ^
                                  ma_dr_flac__crc16_table
                                  [((uint)(ushort)(uVar8 >> 0x30) ^ uVar6 >> 8) & 0xff]);
          case 5:
            uVar6 = (uint)(ushort)((ushort)(uVar6 << 8) ^
                                  ma_dr_flac__crc16_table[(uVar13 ^ uVar6) >> 8 & 0xff]);
          case 4:
            uVar6 = (uint)(ushort)((ushort)(uVar6 << 8) ^
                                  ma_dr_flac__crc16_table[(uVar13 ^ uVar6 >> 8) & 0xff]);
          case 3:
            uVar6 = (uint)(ushort)((ushort)(uVar6 << 8) ^
                                  ma_dr_flac__crc16_table[uVar6 >> 8 ^ (uint)(uVar8 >> 0x18) & 0xff]
                                  );
          case 2:
            uVar6 = (uint)(ushort)((ushort)(uVar6 << 8) ^
                                  ma_dr_flac__crc16_table
                                  [(uVar6 >> 8 ^ (uint)(uVar8 >> 0x10) & 0xffff) & 0xff]);
          case 1:
            uVar11 = (ulong)(ushort)((ushort)(uVar6 << 8) ^
                                    ma_dr_flac__crc16_table[((uint)uVar8 ^ uVar6) >> 8 & 0xff]);
          case 0:
            uVar9 = (ushort)((int)uVar11 << 8) ^
                    ma_dr_flac__crc16_table[((uint)uVar8 ^ (uint)(uVar11 >> 8)) & 0xff];
          default:
            (pFlac->bs).crc16 = uVar9;
            (pFlac->bs).crc16CacheIgnoredBytes = uVar12 >> 3;
          }
        }
        mVar5 = ma_dr_flac__read_uint16(bs,0x10,&desiredCRC16);
        if (mVar5 == 0) {
          mVar10 = MA_AT_END;
        }
        else {
          mVar10 = MA_CRC_MISMATCH;
          if (uVar9 == desiredCRC16) {
            mVar10 = MA_SUCCESS;
          }
        }
      }
      return mVar10;
    }
    mVar5 = ma_dr_flac__read_subframe_header
                      (bs,(ma_dr_flac_subframe *)
                          (&(pFlac->currentFLACFrame).subframes[0].subframeType + lVar14));
    if (mVar5 == 0) {
      return MA_ERROR;
    }
    mVar2 = (pFlac->currentFLACFrame).header.channelAssignment;
    uVar12 = (uint)(pFlac->currentFLACFrame).header.bitsPerSample;
    if (mVar2 == '\b') {
      if (lVar14 != 0x10) goto LAB_0016a44b;
LAB_0016a46f:
      uVar12 = uVar12 + 1;
    }
    else {
      if (lVar14 == 0x10 && mVar2 == '\n') goto LAB_0016a46f;
LAB_0016a44b:
      uVar12 = uVar12 + (lVar14 == 0 && mVar2 == '\t');
    }
    uVar6 = (uint)(&(pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample)[lVar14];
    uVar13 = uVar12 - uVar6;
    if (uVar12 < uVar6 || uVar13 == 0) {
      return MA_ERROR;
    }
    *(undefined8 *)((long)&(pFlac->currentFLACFrame).subframes[0].pSamplesS32 + lVar14) = 0;
    mVar2 = (&(pFlac->currentFLACFrame).subframes[0].subframeType)[lVar14];
    if (mVar2 == ' ') {
      mVar5 = ma_dr_flac__seek_bits
                        (bs,(ulong)(uVar13 * (&(pFlac->currentFLACFrame).subframes[0].lpcOrder)
                                             [lVar14]));
      if (mVar5 == 0) {
        return MA_ERROR;
      }
      mVar5 = ma_dr_flac__read_uint8(bs,4,(ma_uint8 *)((long)register0x00000020 + -0x33));
      if (mVar5 == 0) {
        return MA_ERROR;
      }
      if (uStack_38._5_1_ == '\x0f') {
        return MA_ERROR;
      }
      bitsToSeek = (ulong)(byte)(uStack_38._5_1_ + 1) *
                   (ulong)(&(pFlac->currentFLACFrame).subframes[0].lpcOrder)[lVar14] + 5;
LAB_0016a512:
      mVar5 = ma_dr_flac__seek_bits(bs,bitsToSeek);
      if (mVar5 == 0) {
        return MA_ERROR;
      }
      mVar5 = ma_dr_flac__read_and_seek_residual
                        (bs,(uint)(pFlac->currentFLACFrame).header.blockSizeInPCMFrames,
                         (uint)(&(pFlac->currentFLACFrame).subframes[0].lpcOrder)[lVar14]);
    }
    else {
      if (mVar2 == '\x01') {
        uVar13 = uVar13 * (pFlac->currentFLACFrame).header.blockSizeInPCMFrames;
      }
      else {
        if (mVar2 == '\b') {
          bitsToSeek = (size_t)(uVar13 * (&(pFlac->currentFLACFrame).subframes[0].lpcOrder)[lVar14])
          ;
          goto LAB_0016a512;
        }
        if (mVar2 != '\0') {
          return MA_ERROR;
        }
      }
      mVar5 = ma_dr_flac__seek_bits(bs,(ulong)uVar13);
    }
    if (mVar5 == 0) {
      return MA_ERROR;
    }
    lVar14 = lVar14 + 0x10;
  } while( true );
}

Assistant:

static ma_result ma_dr_flac__seek_flac_frame(ma_dr_flac* pFlac)
{
    int channelCount;
    int i;
    ma_uint16 desiredCRC16;
#ifndef MA_DR_FLAC_NO_CRC
    ma_uint16 actualCRC16;
#endif
    channelCount = ma_dr_flac__get_channel_count_from_channel_assignment(pFlac->currentFLACFrame.header.channelAssignment);
    for (i = 0; i < channelCount; ++i) {
        if (!ma_dr_flac__seek_subframe(&pFlac->bs, &pFlac->currentFLACFrame, i)) {
            return MA_ERROR;
        }
    }
    if (!ma_dr_flac__seek_bits(&pFlac->bs, MA_DR_FLAC_CACHE_L1_BITS_REMAINING(&pFlac->bs) & 7)) {
        return MA_ERROR;
    }
#ifndef MA_DR_FLAC_NO_CRC
    actualCRC16 = ma_dr_flac__flush_crc16(&pFlac->bs);
#endif
    if (!ma_dr_flac__read_uint16(&pFlac->bs, 16, &desiredCRC16)) {
        return MA_AT_END;
    }
#ifndef MA_DR_FLAC_NO_CRC
    if (actualCRC16 != desiredCRC16) {
        return MA_CRC_MISMATCH;
    }
#endif
    return MA_SUCCESS;
}